

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

bool igListBoxHeaderVec2(char *label,ImVec2 size)

{
  bool bVar1;
  char *label_local;
  ImVec2 size_local;
  
  label_local = (char *)size;
  bVar1 = ImGui::ListBoxHeader(label,(ImVec2 *)&label_local);
  return bVar1;
}

Assistant:

CIMGUI_API int _igListBoxHeaderVec2 (char *larg1, ImVec2 const *larg2) {
  int lresult = (int)0 ;
  char *arg1 = (char *) 0 ;
  ImVec2 arg2 ;
  bool result;
  
  arg1 = larg1;
  arg2 = *larg2;
  try {
    result = (bool)igListBoxHeaderVec2((char const *)arg1,arg2);
    lresult = (int)result;
    return lresult;
  } catch (...) {
    return (int)0;
  }
}